

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxdn.cpp
# Opt level: O1

bool __thiscall DSDcc::DSDNXDN::CACLong::decode(CACLong *this)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  CNXDNConvolution conv;
  CNXDNConvolution CStack_48;
  
  CNXDNConvolution::CNXDNConvolution(&CStack_48);
  CNXDNConvolution::start(&CStack_48);
  lVar3 = 0;
  do {
    CNXDNConvolution::decode(&CStack_48,this->m_temp[lVar3 * 2],this->m_temp[lVar3 * 2 + 1]);
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 0xa0);
  CNXDNConvolution::chainback(&CStack_48,this->m_data,0x9c);
  bVar1 = CNXDNCRC::checkCRC16(this->m_data,0x88);
  pcVar2 = "DSDNXDN::CACLong::decode: bad CRC";
  if (bVar1) {
    pcVar2 = "DSDNXDN::CACLong::decode: CRC OK";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,pcVar2,(ulong)bVar1 ^ 0x21);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  CNXDNConvolution::~CNXDNConvolution(&CStack_48);
  return bVar1;
}

Assistant:

bool DSDNXDN::CACLong::decode()
{
    CNXDNConvolution conv;
    conv.start();
    int n = 0;

    for (unsigned int i = 0U; i < 160U; i++)
    {
        uint8_t s0 = m_temp[n++];
        uint8_t s1 = m_temp[n++];

        conv.decode(s0, s1);
    }

    conv.chainback(m_data, 156U);

    if (!CNXDNCRC::checkCRC16(m_data, 136))
    {
        std::cerr << "DSDNXDN::CACLong::decode: bad CRC" << std::endl;
        return false;
    }
    else
    {
        std::cerr << "DSDNXDN::CACLong::decode: CRC OK" << std::endl;
        return true;
    }
}